

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jchuff.c
# Opt level: O0

void emit_restart_e(huff_entropy_ptr entropy,int restart_num)

{
  undefined1 *puVar1;
  char *pcVar2;
  long lVar3;
  undefined4 in_ESI;
  long in_RDI;
  int ci;
  undefined4 in_stack_fffffffffffffff0;
  int iVar4;
  
  emit_eobrun((huff_entropy_ptr)CONCAT44(in_ESI,in_stack_fffffffffffffff0));
  if (*(int *)(in_RDI + 0xc0) == 0) {
    flush_bits_e((huff_entropy_ptr)0x2816f3);
    puVar1 = *(undefined1 **)(in_RDI + 200);
    *(undefined1 **)(in_RDI + 200) = puVar1 + 1;
    *puVar1 = 0xff;
    lVar3 = *(long *)(in_RDI + 0xd0) + -1;
    *(long *)(in_RDI + 0xd0) = lVar3;
    if (lVar3 == 0) {
      dump_buffer_e((huff_entropy_ptr)CONCAT44(in_ESI,in_stack_fffffffffffffff0));
    }
    pcVar2 = *(char **)(in_RDI + 200);
    *(char **)(in_RDI + 200) = pcVar2 + 1;
    *pcVar2 = (char)in_ESI + -0x30;
    lVar3 = *(long *)(in_RDI + 0xd0) + -1;
    *(long *)(in_RDI + 0xd0) = lVar3;
    if (lVar3 == 0) {
      dump_buffer_e((huff_entropy_ptr)CONCAT44(in_ESI,in_stack_fffffffffffffff0));
    }
  }
  if (*(int *)(*(long *)(in_RDI + 0xd8) + 0x1cc) == 0) {
    for (iVar4 = 0; iVar4 < *(int *)(*(long *)(in_RDI + 0xd8) + 0x170); iVar4 = iVar4 + 1) {
      *(undefined4 *)(in_RDI + 0x24 + (long)iVar4 * 4) = 0;
    }
  }
  else {
    *(undefined4 *)(in_RDI + 0xe4) = 0;
    *(undefined4 *)(in_RDI + 0xe8) = 0;
  }
  return;
}

Assistant:

LOCAL(void)
emit_restart_e (huff_entropy_ptr entropy, int restart_num)
{
  int ci;

  emit_eobrun(entropy);

  if (! entropy->gather_statistics) {
    flush_bits_e(entropy);
    emit_byte_e(entropy, 0xFF);
    emit_byte_e(entropy, JPEG_RST0 + restart_num);
  }

  if (entropy->cinfo->Ss == 0) {
    /* Re-initialize DC predictions to 0 */
    for (ci = 0; ci < entropy->cinfo->comps_in_scan; ci++)
      entropy->saved.last_dc_val[ci] = 0;
  } else {
    /* Re-initialize all AC-related fields to 0 */
    entropy->EOBRUN = 0;
    entropy->BE = 0;
  }
}